

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::rmpath(QDir *this,QString *dirPath)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer pQVar5;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QString fn;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined5 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 *local_78;
  undefined1 *local_70;
  QDir *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDir *)0x2806c5);
  bVar2 = QString::isEmpty((QString *)0x2806d4);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff4f,
                                       CONCAT16(in_stack_ffffffffffffff4e,
                                                CONCAT15(in_stack_ffffffffffffff4d,
                                                         in_stack_ffffffffffffff48))),
               in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffa0,"QDir::rmpath: Empty or null file name");
    bVar3 = 0;
  }
  else {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    filePath(in_stack_ffffffffffffffa0,(QString *)&DAT_aaaaaaaaaaaaaaaa);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x280750);
    if (bVar2) {
      pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2807df);
      iVar4 = (*pQVar5->_vptr_QAbstractFileEngine[0x10])(pQVar5,&local_78,1);
      bVar3 = (byte)iVar4 & 1;
    }
    else {
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      bVar3 = QFileSystemEngine::rmpath
                        ((QFileSystemEntry *)
                         CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    QString::~QString((QString *)0x28081a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rmpath(const QString &dirPath) const
{
    Q_D(const QDir);

    if (dirPath.isEmpty()) {
        qWarning("QDir::rmpath: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirPath);
    if (!d->fileEngine)
        return QFileSystemEngine::rmpath(QFileSystemEntry(fn));
    return d->fileEngine->rmdir(fn, true);
}